

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xor.cpp
# Opt level: O1

void example::learning_xor(void)

{
  longdouble *plVar1;
  longdouble lVar2;
  longdouble lVar3;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 acceptableError_00 [16];
  undefined1 learningRate_00 [16];
  undefined1 adaptiveLearningRate [16];
  undefined1 adaptiveLearningRate_00 [16];
  FullyConnected *pFVar4;
  Loss *pLVar5;
  ostream *poVar6;
  tensor ppplVar7;
  char *__to;
  char *__to_00;
  Layer *pLVar8;
  int i_1;
  int i;
  long lVar9;
  tensor in [4];
  tensor out [4];
  SequentialModule moduleB;
  SequentialModule moduleA;
  undefined6 in_stack_fffffffffffffe62;
  undefined6 in_stack_fffffffffffffe72;
  tensor local_188 [4];
  tensor local_168;
  tensor local_160;
  tensor local_158;
  tensor local_150;
  longdouble local_13c;
  longdouble local_130;
  longdouble local_124;
  SequentialModule local_118;
  SequentialModule local_a8;
  
  local_188[0] = type::createTensor(2,1,1);
  local_188[1] = type::createTensor(2,1,1);
  local_188[2] = type::createTensor(2,1,1);
  local_188[3] = type::createTensor(2,1,1);
  local_168 = type::createTensor(1,1,1);
  local_160 = type::createTensor(1,1,1);
  local_158 = type::createTensor(1,1,1);
  local_150 = type::createTensor(1,1,1);
  plVar1 = **local_188[0];
  lVar3 = (longdouble)0;
  *plVar1 = lVar3;
  plVar1[1] = lVar3;
  ***local_168 = lVar3;
  plVar1 = **local_188[1];
  *plVar1 = lVar3;
  lVar2 = (longdouble)1;
  plVar1[1] = lVar2;
  ***local_160 = lVar2;
  plVar1 = **local_188[2];
  *plVar1 = lVar2;
  plVar1[1] = lVar3;
  ***local_158 = lVar2;
  plVar1 = **local_188[3];
  *plVar1 = lVar2;
  plVar1[1] = lVar2;
  ***local_150 = lVar3;
  module::SequentialModule::SequentialModule(&local_a8);
  local_124 = (longdouble)0.001;
  acceptableError._10_6_ = in_stack_fffffffffffffe62;
  acceptableError._0_10_ = local_124;
  module::SequentialModule::setStopParameter(&local_a8,100,(scalar)acceptableError);
  local_130 = (longdouble)1e-10;
  local_13c = (longdouble)0.2;
  learningRate._10_6_ = in_stack_fffffffffffffe62;
  learningRate._0_10_ = local_13c;
  adaptiveLearningRate._10_6_ = in_stack_fffffffffffffe72;
  adaptiveLearningRate._0_10_ = local_130;
  module::SequentialModule::setTrainingParameter
            (&local_a8,(scalar)learningRate,(scalar)adaptiveLearningRate);
  module::SequentialModule::setInput(&local_a8,2,1,1);
  pFVar4 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar4,1,5,false);
  module::SequentialModule::add(&local_a8,(Layer *)pFVar4);
  pLVar5 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar5,1,5,2,false);
  pLVar8 = (Layer *)((long)&pLVar5->_vptr_Loss + (long)pLVar5->_vptr_Loss[-3]);
  module::SequentialModule::add(&local_a8,pLVar8);
  module::SequentialModule::link(&local_a8,(char *)pLVar8,__to);
  module::SequentialModule::training(&local_a8,local_188,&local_168,4,1.0);
  module::SequentialModule::SequentialModule(&local_118);
  acceptableError_00._10_6_ = in_stack_fffffffffffffe62;
  acceptableError_00._0_10_ = local_124;
  module::SequentialModule::setStopParameter(&local_118,1000,(scalar)acceptableError_00);
  learningRate_00._10_6_ = in_stack_fffffffffffffe62;
  learningRate_00._0_10_ = local_13c;
  adaptiveLearningRate_00._10_6_ = in_stack_fffffffffffffe72;
  adaptiveLearningRate_00._0_10_ = local_130;
  module::SequentialModule::setTrainingParameter
            (&local_118,(scalar)learningRate_00,(scalar)adaptiveLearningRate_00);
  module::SequentialModule::setInput(&local_118,2,1,1);
  pFVar4 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar4,2,2,true);
  module::SequentialModule::add(&local_118,(Layer *)pFVar4);
  pLVar5 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar5,1,2,2,true);
  pLVar8 = (Layer *)((long)&pLVar5->_vptr_Loss + (long)pLVar5->_vptr_Loss[-3]);
  module::SequentialModule::add(&local_118,pLVar8);
  module::SequentialModule::link(&local_118,(char *)pLVar8,__to_00);
  module::SequentialModule::training(&local_118,local_188,&local_168,4,1.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Module A (ACTIVATION_GAUSSIAN): ",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  lVar9 = 0;
  do {
    poVar6 = std::ostream::_M_insert<long_double>(***local_188[lVar9]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," xor ",5);
    poVar6 = std::ostream::_M_insert<long_double>((**local_188[lVar9])[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Out : ",9);
    ppplVar7 = module::SequentialModule::predict(&local_a8,local_188[lVar9]);
    poVar6 = std::ostream::_M_insert<long_double>(***ppplVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Layer  : ",0xc);
    ppplVar7 = layer::Layer::getPtrOut
                         (*local_a8._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::ostream::_M_insert<long_double>(***ppplVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n- Module B (ACTIVATION_SIGMOIDE): ",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  lVar9 = 0;
  do {
    poVar6 = std::ostream::_M_insert<long_double>(***local_188[lVar9]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," xor ",5);
    poVar6 = std::ostream::_M_insert<long_double>((**local_188[lVar9])[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," => ",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Out : ",9);
    ppplVar7 = module::SequentialModule::predict(&local_118,local_188[lVar9]);
    poVar6 = std::ostream::_M_insert<long_double>(***ppplVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Layer  : ",0xc);
    ppplVar7 = layer::Layer::getPtrOut
                         (*local_118._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::ostream::_M_insert<long_double>(***ppplVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    ppplVar7 = layer::Layer::getPtrOut
                         (*local_118._lLayers.
                           super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    poVar6 = std::ostream::_M_insert<long_double>((**ppplVar7)[1]);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  module::SequentialModule::~SequentialModule(&local_118);
  module::SequentialModule::~SequentialModule(&local_a8);
  return;
}

Assistant:

void learning_xor()
    {


        type::tensor in[4];
        in[0] = type::createTensor(2, 1, 1);
        in[1] = type::createTensor(2, 1, 1);
        in[2] = type::createTensor(2, 1, 1);
        in[3] = type::createTensor(2, 1, 1);

        type::tensor out[4];
        out[0] = type::createTensor(1, 1, 1);
        out[1] = type::createTensor(1, 1, 1);
        out[2] = type::createTensor(1, 1, 1);
        out[3] = type::createTensor(1, 1, 1);



        (**in[0])[0] = 0;
        (**in[0])[1] = 0;
        (***out[0]) = 0;

        (**in[1])[0] = 0;
        (**in[1])[1] = 1;
        (***out[1]) = 1;

        (**in[2])[0] = 1;
        (**in[2])[1] = 0;
        (***out[2]) = 1;

        (**in[3])[0] = 1;
        (**in[3])[1] = 1;
        (***out[3]) = 0;



        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule moduleA;
        moduleA.setStopParameter(100, 0.001);
        moduleA.setTrainingParameter(0.2, 0.0000000001);
        moduleA.setInput(2);
        moduleA.add(new layer::FullyConnected(1, ACTIVATION_GAUSSIAN, false));
        moduleA.add(new layer::Loss(1, ACTIVATION_GAUSSIAN, LOSS_LOGLOSS, false));
        moduleA.link();
        moduleA.training(in, out, 4, 1);

        function::tool::initRandTool(486446);
        module::SequentialModule moduleB;
        moduleB.setStopParameter(1000, 0.001);
        moduleB.setTrainingParameter(0.2, 0.0000000001);
        moduleB.setInput(2);
        moduleB.add(new layer::FullyConnected(2, ACTIVATION_SIGMOIDE, true));
        moduleB.add(new layer::Loss(1, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        moduleB.link();
        moduleB.training(in, out, 4, 1);


        std::cout << "- Module A (ACTIVATION_GAUSSIAN): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleA.predict(in[i]) << std::endl;
            std::cout << "   Layer  : " << (**moduleA.getLayer(0)->getPtrOut())[0] << std::endl;
        }


        std::cout << "\n\n- Module B (ACTIVATION_SIGMOIDE): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleB.predict(in[i]) << std::endl;
            std::cout << "   Layer  : "
            << (**moduleB.getLayer(0)->getPtrOut())[0] << ", "
            << (**moduleB.getLayer(0)->getPtrOut())[1] << std::endl;
        }
    }